

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_hash.c
# Opt level: O3

int fiobj_hash_set(FIOBJ hash,FIOBJ key,FIOBJ obj)

{
  uint uVar1;
  FIOBJ hash_value;
  fiobj_object_vtable_s *pfVar2;
  fio_str_info_s fStack_38;
  
  if (((uint)hash & 7) != 4) {
    __assert_fail("hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_hash.c"
                  ,200,"int fiobj_hash_set(FIOBJ, FIOBJ, FIOBJ)");
  }
  if (((uint)key & 7) == 2) {
    fiobj_str_freeze(key);
    hash_value = fiobj_str_hash(key);
    goto LAB_0014232b;
  }
  uVar1 = (uint)key & 6;
  hash_value = key;
  if (((uVar1 == 6) || (key == 0)) || ((key & 1) != 0)) goto LAB_0014232b;
  if ((key & 6) == 0) {
    switch(*(undefined1 *)(key & 0xfffffffffffffff8)) {
    case 0x27:
      pfVar2 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case 0x28:
      goto switchD_001422ed_caseD_28;
    case 0x29:
      pfVar2 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case 0x2a:
      goto switchD_001422ed_caseD_2a;
    case 0x2b:
      pfVar2 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar2 = &FIOBJECT_VTABLE_NUMBER;
    }
  }
  else if (uVar1 == 2) {
switchD_001422ed_caseD_28:
    pfVar2 = &FIOBJECT_VTABLE_STRING;
  }
  else {
switchD_001422ed_caseD_2a:
    pfVar2 = &FIOBJECT_VTABLE_HASH;
  }
  (*pfVar2->to_str)(&fStack_38,key);
  hash_value = fio_siphash13(fStack_38.data,fStack_38.len,0x1456f2,0x145bc9);
LAB_0014232b:
  fio_hash___insert((fio_hash___s *)((hash & 0xfffffffffffffff8) + 8),hash_value,key,obj,
                    (FIOBJ *)0x0);
  fiobj_free(obj);
  return 0;
}

Assistant:

int fiobj_hash_set(FIOBJ hash, FIOBJ key, FIOBJ obj) {
  assert(hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH));
  if (FIOBJ_TYPE_IS(key, FIOBJ_T_STRING))
    fiobj_str_freeze(key);
  fio_hash___insert(&obj2hash(hash)->hash, fiobj_obj2hash(key), key, obj, NULL);
  fiobj_free(obj); /* take ownership - free the user's reference. */
  return 0;
}